

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFMatrix.cc
# Opt level: O3

Rectangle * __thiscall
QPDFMatrix::transformRectangle(Rectangle *__return_storage_ptr__,QPDFMatrix *this,Rectangle r)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  undefined1 (*pauVar4) [16];
  double *pdVar5;
  double *pdVar6;
  undefined1 (*pauVar7) [16];
  long lVar8;
  double *pdVar9;
  double *pdVar10;
  undefined1 (*pauVar11) [16];
  value_type_conflict5 *__val;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  
  pdVar6 = (double *)operator_new(0x20);
  *pdVar6 = 0.0;
  pdVar6[1] = 0.0;
  pdVar6[2] = 0.0;
  pdVar6[3] = 0.0;
  pauVar7 = (undefined1 (*) [16])operator_new(0x20);
  dVar3 = this->e;
  dVar15 = this->d;
  dVar18 = this->c * r.lly;
  dVar19 = this->c * r.ury;
  dVar20 = this->a;
  dVar16 = this->b;
  dVar12 = dVar20 * r.llx;
  dVar13 = dVar12 + dVar18 + dVar3;
  dVar17 = this->f;
  *pdVar6 = dVar13;
  pdVar6[1] = dVar12 + dVar19 + dVar3;
  dVar14 = dVar15 * r.lly;
  dVar15 = dVar15 * r.ury;
  dVar12 = r.llx * dVar16;
  dVar2 = dVar12 + dVar14 + dVar17;
  dVar12 = dVar12 + dVar15 + dVar17;
  auVar1._8_4_ = SUB84(dVar12,0);
  auVar1._0_8_ = dVar2;
  auVar1._12_4_ = (int)((ulong)dVar12 >> 0x20);
  *pauVar7 = auVar1;
  dVar20 = dVar20 * r.urx;
  pdVar6[2] = dVar20 + dVar18 + dVar3;
  pdVar6[3] = dVar20 + dVar19 + dVar3;
  dVar16 = dVar16 * r.urx;
  *(double *)pauVar7[1] = dVar16 + dVar14 + dVar17;
  *(double *)(pauVar7[1] + 8) = dVar16 + dVar15 + dVar17;
  lVar8 = 8;
  pdVar9 = pdVar6;
  dVar20 = dVar13;
  do {
    dVar16 = *(double *)((long)pdVar6 + lVar8);
    pdVar10 = (double *)((long)pdVar6 + lVar8);
    if (dVar20 <= *(double *)((long)pdVar6 + lVar8)) {
      dVar16 = dVar20;
      pdVar10 = pdVar9;
    }
    pdVar9 = pdVar10;
    dVar20 = dVar16;
    lVar8 = lVar8 + 8;
  } while (lVar8 != 0x20);
  lVar8 = 8;
  pauVar11 = pauVar7;
  dVar20 = dVar2;
  do {
    dVar16 = *(double *)(*pauVar7 + lVar8);
    pauVar4 = (undefined1 (*) [16])(*pauVar7 + lVar8);
    if (dVar20 <= *(double *)(*pauVar7 + lVar8)) {
      dVar16 = dVar20;
      pauVar4 = pauVar11;
    }
    pauVar11 = pauVar4;
    dVar20 = dVar16;
    lVar8 = lVar8 + 8;
  } while (lVar8 != 0x20);
  dVar20 = *(double *)*pauVar11;
  lVar8 = 8;
  pdVar10 = pdVar6;
  do {
    dVar16 = *(double *)((long)pdVar6 + lVar8);
    pdVar5 = (double *)((long)pdVar6 + lVar8);
    if (*(double *)((long)pdVar6 + lVar8) <= dVar13) {
      dVar16 = dVar13;
      pdVar5 = pdVar10;
    }
    pdVar10 = pdVar5;
    dVar13 = dVar16;
    lVar8 = lVar8 + 8;
  } while (lVar8 != 0x20);
  dVar16 = *pdVar10;
  lVar8 = 8;
  pauVar11 = pauVar7;
  do {
    dVar17 = *(double *)(*pauVar7 + lVar8);
    pauVar4 = (undefined1 (*) [16])(*pauVar7 + lVar8);
    if (dVar17 <= dVar2) {
      dVar17 = dVar2;
      pauVar4 = pauVar11;
    }
    pauVar11 = pauVar4;
    lVar8 = lVar8 + 8;
    dVar2 = dVar17;
  } while (lVar8 != 0x20);
  dVar17 = *(double *)*pauVar11;
  __return_storage_ptr__->llx = *pdVar9;
  __return_storage_ptr__->lly = dVar20;
  __return_storage_ptr__->urx = dVar16;
  __return_storage_ptr__->ury = dVar17;
  operator_delete(pauVar7,0x20);
  operator_delete(pdVar6,0x20);
  return __return_storage_ptr__;
}

Assistant:

QPDFObjectHandle::Rectangle
QPDFMatrix::transformRectangle(QPDFObjectHandle::Rectangle r) const
{
    std::vector<double> tx(4);
    std::vector<double> ty(4);
    transform(r.llx, r.lly, tx.at(0), ty.at(0));
    transform(r.llx, r.ury, tx.at(1), ty.at(1));
    transform(r.urx, r.lly, tx.at(2), ty.at(2));
    transform(r.urx, r.ury, tx.at(3), ty.at(3));
    return {
        *std::min_element(tx.begin(), tx.end()),
        *std::min_element(ty.begin(), ty.end()),
        *std::max_element(tx.begin(), tx.end()),
        *std::max_element(ty.begin(), ty.end())};
}